

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::ColumnMetaData::read(ColumnMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::PageEncodingStats,_true> *this_00;
  pointer ptVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  reference pvVar6;
  reference pvVar7;
  ssize_t sVar8;
  reference pvVar9;
  reference pvVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar11;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  vector<duckdb_parquet::KeyValue,_true> *this_03;
  ulong uVar12;
  Statistics *this_04;
  int32_t ecast97;
  ColumnMetaData *local_110;
  TType _etype118;
  int16_t fid;
  int32_t ecast103;
  TType ftype;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  vector<duckdb_parquet::KeyValue,_true> *local_b0;
  vector<duckdb_parquet::Encoding::type,_true> *local_a8;
  Statistics *local_a0;
  int64_t *local_98;
  int64_t *local_90;
  int64_t *local_88;
  int64_t *local_80;
  int64_t *local_78;
  int64_t *local_70;
  int64_t *local_68;
  int32_t *local_60;
  SizeStatistics *local_58;
  string fname;
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar3 = (*this_01->_vptr_TProtocol[0x19])(this_01,&fname);
  local_58 = &this->size_statistics;
  local_60 = &this->bloom_filter_length;
  local_68 = &this->bloom_filter_offset;
  this_00 = &this->encoding_stats;
  this_04 = &this->statistics;
  local_70 = &this->dictionary_page_offset;
  local_78 = &this->index_page_offset;
  local_80 = &this->data_page_offset;
  local_b0 = &this->key_value_metadata;
  local_88 = &this->total_compressed_size;
  local_90 = &this->total_uncompressed_size;
  local_98 = &this->num_values;
  local_b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->path_in_schema;
  local_a8 = &this->encodings;
  local_c0 = 0;
  local_f8 = 0;
  local_f0 = 0;
  local_e8 = 0;
  local_c8 = 0;
  local_e0 = 0;
  local_d8 = 0;
  local_d0 = 0;
  local_110 = this;
  do {
    iVar4 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&fname,&ftype,&fid);
    this_03 = local_b0;
    this_02 = local_b8;
    iVar4 = iVar4 + iVar3;
    if (ftype == T_STOP) {
      iVar3 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if (((byte)local_c8 & (byte)local_e0 & (byte)local_d8 &
           (byte)local_f0 & (byte)local_e8 & (byte)local_c0 & (byte)local_f8 & (byte)local_d0 & 1)
          == 0) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar11[1] = puVar11 + 3;
        puVar11[2] = 0;
        *(undefined1 *)(puVar11 + 3) = 0;
        *puVar11 = &PTR__TException_017b9280;
        *(undefined4 *)(puVar11 + 5) = 1;
        __cxa_throw(puVar11,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      std::__cxx11::string::~string((string *)&fname);
      this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    switch(fid) {
    case 1:
      if (ftype != T_I32) {
        iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        break;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x27])(this_01,&ecast97);
      iVar5 = iVar5 + iVar4;
      local_110->type = ecast97;
      local_c0 = CONCAT71((uint7)(uint3)((uint)ecast97 >> 8),1);
      goto LAB_00db3417;
    case 2:
      if (ftype == T_LIST) {
        ptVar1 = (local_110->encodings).
                 super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 .
                 super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((local_110->encodings).
            super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            .
            super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            ._M_impl.super__Vector_impl_data._M_finish != ptVar1) {
          (local_110->encodings).
          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
          .
          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
          ._M_impl.super__Vector_impl_data._M_finish = ptVar1;
        }
        local_a0 = this_04;
        iVar5 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype118,&ecast97);
        std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
        ::resize(&local_a8->
                  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 ,(ulong)(uint)ecast97);
        iVar5 = iVar5 + iVar4;
        for (uVar12 = 0; uVar12 < (uint)ecast97; uVar12 = uVar12 + 1) {
          iVar3 = (*this_01->_vptr_TProtocol[0x27])(this_01,&ecast103);
          iVar2 = ecast103;
          pvVar10 = duckdb::vector<duckdb_parquet::Encoding::type,_true>::get<true>(local_a8,uVar12)
          ;
          iVar5 = iVar5 + iVar3;
          *pvVar10 = iVar2;
        }
        iVar3 = (*this_01->_vptr_TProtocol[0x20])(this_01);
        iVar5 = iVar3 + iVar5;
        local_f8 = CONCAT71((int7)(CONCAT44(extraout_var_04,iVar3) >> 8),1);
        this_04 = local_a0;
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 3:
      if (ftype == T_LIST) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
        iVar5 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype118,&ecast97);
        duckdb::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(this_02,(ulong)(uint)ecast97);
        iVar5 = iVar5 + iVar4;
        for (uVar12 = 0; uVar12 < (uint)ecast97; uVar12 = uVar12 + 1) {
          pvVar7 = duckdb::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)this_02,uVar12);
          iVar3 = (*this_01->_vptr_TProtocol[0x2a])(this_01,pvVar7);
          iVar5 = iVar5 + iVar3;
          this_02 = local_b8;
        }
        iVar3 = (*this_01->_vptr_TProtocol[0x20])(this_01);
        iVar5 = iVar3 + iVar5;
        local_f0 = CONCAT71((int7)(CONCAT44(extraout_var_03,iVar3) >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 4:
      if (ftype == T_I32) {
        iVar5 = (*this_01->_vptr_TProtocol[0x27])(this_01,&ecast97);
        iVar5 = iVar5 + iVar4;
        local_110->codec = ecast97;
        local_e8 = CONCAT71((uint7)(uint3)((uint)ecast97 >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 5:
      if (ftype == T_I64) {
        iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_98);
        iVar5 = iVar3 + iVar4;
        local_c8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 6:
      if (ftype == T_I64) {
        iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_90);
        iVar5 = iVar3 + iVar4;
        local_e0 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 7:
      if (ftype == T_I64) {
        iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_88);
        iVar5 = iVar3 + iVar4;
        local_d8 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar3) >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 8:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::clear
                  (&local_b0->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                  );
        iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype118,&ecast97);
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::resize
                  (&this_03->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ,(ulong)(uint)ecast97);
        iVar3 = iVar3 + iVar4;
        for (uVar12 = 0; uVar12 < (uint)ecast97; uVar12 = uVar12 + 1) {
          pvVar9 = duckdb::vector<duckdb_parquet::KeyValue,_true>::get<true>(this_03,uVar12);
          iVar4 = (**(code **)(*(long *)pvVar9 + 0x10))(pvVar9,this_01);
          iVar3 = iVar3 + iVar4;
          this_03 = local_b0;
        }
        iVar5 = (*this_01->_vptr_TProtocol[0x20])(this_01);
        iVar5 = iVar5 + iVar3;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 9:
      if (ftype == T_I64) {
        iVar3 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_80);
        iVar5 = iVar3 + iVar4;
        local_d0 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar3) >> 8),1);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 10:
      if (ftype == T_I64) {
        iVar5 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_78);
        iVar5 = iVar5 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 2);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0xb:
      if (ftype == T_I64) {
        iVar5 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_70);
        iVar5 = iVar5 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 4);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0xc:
      if (ftype == T_STRUCT) {
        sVar8 = Statistics::read(this_04,__fd,__buf_00,0x1080e50);
        iVar5 = (int)sVar8 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 8);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0xd:
      if (ftype == T_LIST) {
        std::
        vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        ::clear(&this_00->
                 super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
               );
        iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,&_etype118,&ecast97);
        std::
        vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        ::resize(&this_00->
                  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 ,(ulong)(uint)ecast97);
        iVar3 = iVar3 + iVar4;
        for (uVar12 = 0; uVar12 < (uint)ecast97; uVar12 = uVar12 + 1) {
          pvVar6 = duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::get<true>
                             (this_00,uVar12);
          iVar4 = (**(code **)(*(long *)pvVar6 + 0x10))(pvVar6,this_01);
          iVar3 = iVar3 + iVar4;
        }
        iVar5 = (*this_01->_vptr_TProtocol[0x20])(this_01);
        iVar5 = iVar5 + iVar3;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 0x10);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0xe:
      if (ftype == T_I64) {
        iVar5 = (*this_01->_vptr_TProtocol[0x28])(this_01,local_68);
        iVar5 = iVar5 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 0x20);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0xf:
      if (ftype == T_I32) {
        iVar5 = (*this_01->_vptr_TProtocol[0x27])(this_01,local_60);
        iVar5 = iVar5 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 0x40);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    case 0x10:
      if (ftype == T_STRUCT) {
        sVar8 = SizeStatistics::read(local_58,__fd,__buf_00,0x1080e50);
        iVar5 = (int)sVar8 + iVar4;
        local_110->__isset = (_ColumnMetaData__isset)((byte)local_110->__isset | 0x80);
        goto LAB_00db3417;
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
      break;
    default:
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
    }
    iVar5 = iVar5 + iVar4;
LAB_00db3417:
    iVar3 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t ColumnMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_type = false;
  bool isset_encodings = false;
  bool isset_path_in_schema = false;
  bool isset_codec = false;
  bool isset_num_values = false;
  bool isset_total_uncompressed_size = false;
  bool isset_total_compressed_size = false;
  bool isset_data_page_offset = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast97;
          xfer += iprot->readI32(ecast97);
          this->type = static_cast<Type::type>(ecast97);
          isset_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encodings.clear();
            uint32_t _size98;
            ::apache::thrift::protocol::TType _etype101;
            xfer += iprot->readListBegin(_etype101, _size98);
            this->encodings.resize(_size98);
            uint32_t _i102;
            for (_i102 = 0; _i102 < _size98; ++_i102)
            {
              int32_t ecast103;
              xfer += iprot->readI32(ecast103);
              this->encodings[_i102] = static_cast<Encoding::type>(ecast103);
            }
            xfer += iprot->readListEnd();
          }
          isset_encodings = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size104;
            ::apache::thrift::protocol::TType _etype107;
            xfer += iprot->readListBegin(_etype107, _size104);
            this->path_in_schema.resize(_size104);
            uint32_t _i108;
            for (_i108 = 0; _i108 < _size104; ++_i108)
            {
              xfer += iprot->readString(this->path_in_schema[_i108]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast109;
          xfer += iprot->readI32(ecast109);
          this->codec = static_cast<CompressionCodec::type>(ecast109);
          isset_codec = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_uncompressed_size);
          isset_total_uncompressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          isset_total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->key_value_metadata.clear();
            uint32_t _size110;
            ::apache::thrift::protocol::TType _etype113;
            xfer += iprot->readListBegin(_etype113, _size110);
            this->key_value_metadata.resize(_size110);
            uint32_t _i114;
            for (_i114 = 0; _i114 < _size110; ++_i114)
            {
              xfer += this->key_value_metadata[_i114].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.key_value_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->data_page_offset);
          isset_data_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->index_page_offset);
          this->__isset.index_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->dictionary_page_offset);
          this->__isset.dictionary_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->statistics.read(iprot);
          this->__isset.statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 13:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encoding_stats.clear();
            uint32_t _size115;
            ::apache::thrift::protocol::TType _etype118;
            xfer += iprot->readListBegin(_etype118, _size115);
            this->encoding_stats.resize(_size115);
            uint32_t _i119;
            for (_i119 = 0; _i119 < _size115; ++_i119)
            {
              xfer += this->encoding_stats[_i119].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.encoding_stats = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 14:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->bloom_filter_offset);
          this->__isset.bloom_filter_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 15:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->bloom_filter_length);
          this->__isset.bloom_filter_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 16:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->size_statistics.read(iprot);
          this->__isset.size_statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encodings)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_codec)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_uncompressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_compressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_data_page_offset)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}